

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::RenderBuffer::RenderBuffer
          (RenderBuffer *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,
          SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer,bool useSync,bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_58;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48 [2];
  undefined1 local_22;
  undefined1 local_21;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *pSStack_20;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program_local;
  RenderBuffer *this_local;
  
  local_22 = serverSync;
  local_21 = useSync;
  pSStack_20 = buffer;
  buffer_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)program;
  program_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)this;
  Operation::Operation(&this->super_Operation,"RenderBuffer",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__RenderBuffer_03277998;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&this->m_program,program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr(&this->m_buffer,buffer);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Program>
            (local_48,program);
  Operation::readGLObject(&this->super_Operation,local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>
            (&local_58,buffer);
  Operation::readGLObject(&this->super_Operation,&local_58);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(&local_58);
  return;
}

Assistant:

RenderBuffer::RenderBuffer (SharedPtr<Program> program, SharedPtr<Buffer> buffer, bool useSync, bool serverSync)
	: Operation	("RenderBuffer", useSync, serverSync)
	, m_program	(program)
	, m_buffer	(buffer)
{
	readGLObject(SharedPtr<Object>(program));
	readGLObject(SharedPtr<Object>(buffer));
}